

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

uint nk_check_flags_text(nk_context *ctx,char *text,int len,uint flags,uint value)

{
  nk_bool nVar1;
  uint in_ECX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  int old_active;
  nk_bool in_stack_00000028;
  int in_stack_0000002c;
  char *in_stack_00000030;
  nk_context *in_stack_00000038;
  uint local_20;
  uint local_4;
  
  local_4 = in_ECX;
  if ((in_RDI != 0) && (in_RSI != 0)) {
    nVar1 = nk_check_text(in_stack_00000038,in_stack_00000030,in_stack_0000002c,in_stack_00000028);
    if (nVar1 == 0) {
      local_20 = (in_R8D ^ 0xffffffff) & in_ECX;
    }
    else {
      local_20 = in_R8D | in_ECX;
    }
    local_4 = local_20;
  }
  return local_4;
}

Assistant:

NK_API unsigned int
nk_check_flags_text(struct nk_context *ctx, const char *text, int len,
unsigned int flags, unsigned int value)
{
int old_active;
NK_ASSERT(ctx);
NK_ASSERT(text);
if (!ctx || !text) return flags;
old_active = (int)((flags & value) & value);
if (nk_check_text(ctx, text, len, old_active))
flags |= value;
else flags &= ~value;
return flags;
}